

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildingUnitTiles.cpp
# Opt level: O0

void __thiscall BuildingUnitTiles::BuildingUnitTiles(BuildingUnitTiles *this)

{
  BuildingUnitTiles *this_local;
  
  this->building = HighRise;
  this->unit = Infantry;
  this->zone = 0;
  this->durability = 1;
  this->reward = 1;
  this->rewardType = Energy;
  this->isUnit = false;
  return;
}

Assistant:

BuildingUnitTiles::BuildingUnitTiles() {
    this->building = Buildings::HighRise;
    this->unit = Units::Infantry;
    this->zone = 0;
    this->durability = 1;
    this->reward = 1;
    this->rewardType = Rewards::Energy;
    this->isUnit = false;
}